

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::GLSL420Pack::Utils::getBlockVariableDefinition_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,qualifierSet *qualifiers,GLchar *type_name,
          GLchar *variable_name)

{
  qualifierSet *qualifiers_00;
  size_t position;
  size_t local_50;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"QUALIFIER_LISTTYPE VARIABLE_NAME","");
  local_50 = 0;
  getQualifiersListString_abi_cxx11_(&local_48,this,qualifiers_00);
  replaceToken("QUALIFIER_LIST",&local_50,local_48._M_dataplus._M_p,__return_storage_ptr__);
  replaceToken("TYPE",&local_50,(GLchar *)qualifiers,__return_storage_ptr__);
  replaceToken("VARIABLE_NAME",&local_50,type_name,__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getBlockVariableDefinition(const qualifierSet& qualifiers, const glw::GLchar* type_name,
											  const glw::GLchar* variable_name)
{
	/* Templates */
	static const GLchar* def_template = "QUALIFIER_LISTTYPE VARIABLE_NAME";

	/* Tokens */
	static const GLchar* token_type			 = "TYPE";
	static const GLchar* token_variable_name = "VARIABLE_NAME";
	static const GLchar* token_qual_list	 = "QUALIFIER_LIST";

	/* Variables */
	std::string variable_definition = def_template;
	size_t		position			= 0;

	/* Get qualifiers list */
	const std::string& list = getQualifiersListString(qualifiers);

	/* Replace tokens */
	Utils::replaceToken(token_qual_list, position, list.c_str(), variable_definition);
	Utils::replaceToken(token_type, position, type_name, variable_definition);
	Utils::replaceToken(token_variable_name, position, variable_name, variable_definition);

	/* Done */
	return variable_definition;
}